

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bcm2835.c
# Opt level: O3

uint8_t bcm2835_gpio_get_pud(uint8_t pin)

{
  uint8_t uVar1;
  uint32_t uVar2;
  
  uVar1 = '\b';
  if (pud_type_rpi4 == '\x01') {
    if (debug == '\0') {
      uVar2 = bcm2835_gpio[(ulong)(pin >> 4) + 0x39];
    }
    else {
      uVar2 = 0;
      printf("bcm2835_peri_read_nb  paddr %p\n");
    }
    uVar1 = (uint8_t)(0x8010200 >> ((byte)((uVar2 >> (pin * '\x02' & 0x1f)) << 3) & 0x1f));
  }
  return uVar1;
}

Assistant:

uint8_t bcm2835_gpio_get_pud(uint8_t pin)
{
    uint8_t ret = BCM2835_GPIO_PUD_ERROR;
    
    if( pud_type_rpi4 )
    {
        uint32_t bits;
        volatile uint32_t* paddr = bcm2835_gpio + BCM2835_GPPUPPDN0/4 + (pin >> 4);
        bits = (bcm2835_peri_read_nb( paddr ) >> ((pin & 0xf)<<1)) & 0x3;
        
        switch (bits)
        {
            case 0: ret = BCM2835_GPIO_PUD_OFF; break;
            case 1: ret = BCM2835_GPIO_PUD_UP; break;
            case 2: ret = BCM2835_GPIO_PUD_DOWN; break;
            default: ret = BCM2835_GPIO_PUD_ERROR;
        }   
    }
    
    return ret;
}